

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.cc
# Opt level: O2

void __thiscall Graph::trim(Graph *this)

{
  vector<Graph::GNode,_std::allocator<Graph::GNode>_> *this_00;
  vector<Graph::GEdge,_std::allocator<Graph::GEdge>_> *this_01;
  reference pvVar1;
  reference pvVar2;
  unsigned_long i;
  ulong uVar3;
  pointer pGVar4;
  unsigned_long x;
  ulong __n;
  iterator __begin2;
  pointer pGVar5;
  long lVar6;
  unsigned_long j;
  bool bVar7;
  
  this_00 = &this->nodes;
  uVar3 = 0;
  while( true ) {
    pGVar5 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pGVar4 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)pGVar4 - (long)pGVar5 >> 6) <= uVar3) break;
    for (; pGVar5 != pGVar4; pGVar5 = pGVar5 + 1) {
      this_01 = &pGVar5->edges;
      lVar6 = 0;
      for (__n = 0; __n < (ulong)((long)(pGVar5->edges).
                                        super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pGVar5->edges).
                                        super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4);
          __n = __n + 1) {
        pvVar1 = std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::at(this_01,__n);
        if ((ulong)((long)(pvVar1->node->edges).
                          super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pvVar1->node->edges).
                         super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>._M_impl.
                         super__Vector_impl_data._M_start) < 0x11) {
          std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::erase
                    (this_01,(GEdge *)((long)&((this_01->
                                               super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->weight +
                                      lVar6));
        }
        lVar6 = lVar6 + 0x10;
      }
    }
    uVar3 = uVar3 + 1;
  }
  for (uVar3 = 0; uVar3 < (ulong)((long)pGVar4 - (long)pGVar5 >> 6); uVar3 = uVar3 + 1) {
    pvVar2 = std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::at(this_00,uVar3);
    if ((ulong)((long)(pvVar2->edges).
                      super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pvVar2->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
      std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::erase
                (this_00,(this_00->super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar3);
      bVar7 = uVar3 < 2;
      uVar3 = uVar3 - 2;
      if (bVar7) {
        uVar3 = 0;
      }
    }
    pGVar5 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pGVar4 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (uVar3 = 0; uVar3 < (ulong)((long)pGVar4 - (long)pGVar5 >> 6); uVar3 = uVar3 + 1) {
    pvVar2 = std::vector<Graph::GNode,_std::allocator<Graph::GNode>_>::at(this_00,uVar3);
    pvVar2->key = (int)uVar3;
    pGVar5 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pGVar4 = (this->nodes).super__Vector_base<Graph::GNode,_std::allocator<Graph::GNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void Graph::trim() {
    // remove all bad edges from nodes
    for (unsigned long int i = 0;
         i < nodes.size(); ++i) { // this needs to be done probably fewer times, try and prove this
        for (auto & node : nodes) {
            for (unsigned long int x = 0; x < node.edges.size(); ++x) {
                if (node.edges.at(x).node->edges.size() < 2) {
                    node.edges.erase(node.edges.begin() + x);
                }
            }
        }
    }


    // remove all nodes with only one edge
    for (unsigned long int i = 0; i < nodes.size(); ++i) {
        if (nodes.at(i).edges.size() < 2) {
            nodes.erase(nodes.begin() + i);
            if (i < 2) {
                i = 0;
            } else {
                i -= 2;
            }
        }
    }

    // reset all of the key values
    for (unsigned long int j = 0; j < nodes.size(); ++j) {
        nodes.at(j).key = j;
    }

}